

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeTarget(Parse *pParse,Expr *pExpr,int target)

{
  byte bVar1;
  u8 enc;
  Vdbe *p;
  Table *pTVar2;
  Select *pSVar3;
  VList *pIn;
  AggInfo *pAVar4;
  sqlite3 *db;
  _func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *p_Var5;
  undefined3 uVar6;
  u32 uVar7;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  VdbeOp *pVVar15;
  Parse *pPVar16;
  FuncDef *zP4;
  CollSeq *pCVar17;
  VTable *pVVar18;
  FuncDef *pFVar19;
  long lVar20;
  Expr *pEVar21;
  ulong uVar22;
  Vdbe *v;
  SrcList **ppSVar23;
  ExprList_item *pEVar24;
  FuncDef *pFVar25;
  FuncDef *pFVar26;
  char *pcVar27;
  uint opcode;
  Expr *pEVar28;
  Expr *pExpr_00;
  int iVar29;
  ExprList *pEVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  byte bVar34;
  int iVar35;
  int regFree1;
  Parse *local_108;
  ulong local_100;
  int regFree2;
  sqlite3 *local_f0;
  undefined8 local_e8;
  ExprList *local_e0;
  int regFree2_1;
  int regFree1_1;
  CollSeq *local_d0;
  Expr opCompare;
  Expr tempX;
  
  bVar34 = 0;
code_r0x00165cd6:
  p = pParse->pVdbe;
  regFree1 = 0;
  regFree2 = 0;
  if (p == (Vdbe *)0x0) {
    return 0;
  }
LAB_00165d0f:
  iVar29 = target;
  local_108 = pParse;
  if (pExpr == (Expr *)0x0) {
switchD_00165d2d_caseD_72:
    iVar12 = 0x49;
    uVar10 = 0;
LAB_00165db1:
    sqlite3VdbeAddOp2(p,iVar12,uVar10,iVar29);
    return target;
  }
  bVar1 = pExpr->op;
  uVar10 = (uint)bVar1;
  switch(bVar1) {
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
switchD_00165d2d_caseD_60:
    iVar12 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar29 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    uVar10 = (uint)bVar1;
    break;
  case 0x6a:
  case 0xa6:
  case 0xad:
    goto switchD_00165d2d_caseD_6a;
  case 0x6b:
switchD_00165d2d_caseD_6b:
    iVar29 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    sqlite3VdbeAddOp2(p,(uint)bVar1,iVar29,target);
    goto LAB_0016692c;
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0xac:
    goto switchD_00165d2d_caseD_6c;
  case 0x6e:
    sqlite3VdbeLoadString(p,target,(pExpr->u).zToken);
    return target;
  case 0x72:
    goto switchD_00165d2d_caseD_72;
  case 0x83:
    iVar29 = ((pExpr->x).pSelect)->pEList->nExpr;
    if (iVar29 == 1) {
switchD_00165d55_caseD_14:
      iVar29 = sqlite3CodeSubselect(pParse,pExpr);
      return iVar29;
    }
    sqlite3SubselectError(pParse,iVar29,1);
    goto LAB_0016692c;
  case 0x91:
    pcVar27 = (pExpr->u).zToken;
    iVar29 = 0;
LAB_001667e2:
    codeReal(p,pcVar27,iVar29,target);
    return target;
  case 0x92:
    pcVar27 = (pExpr->u).zToken;
    iVar29 = sqlite3Strlen30(pcVar27 + 2);
    pcVar27 = (char *)sqlite3HexToBlob(p->db,pcVar27 + 2,iVar29 + -1);
    iVar11 = (iVar29 + -1) / 2;
    iVar35 = -7;
    iVar29 = 0x4b;
    iVar12 = target;
    goto LAB_00166886;
  case 0x93:
    iVar29 = 0;
LAB_00166455:
    codeInteger(pParse,pExpr,iVar29,target);
    return target;
  case 0x94:
    sqlite3VdbeAddOp2(p,0x4c,(int)pExpr->iColumn,target);
    if ((pExpr->u).zToken[1] == '\0') {
      return target;
    }
    pIn = pParse->pVList;
    pcVar27 = sqlite3VListNumToName(pIn,(int)pExpr->iColumn);
    *pIn = 0;
    sqlite3VdbeAppendP4(p,pcVar27,-1);
    return target;
  case 0x9f:
    uVar10 = (uint)((pExpr->u).zToken[4] == '\0');
    iVar12 = 0x46;
    goto LAB_00165db1;
  case 0xa0:
switchD_00165d2d_caseD_a0:
    uVar10 = bVar1 == 0x2d | 0x34;
    uVar13 = 0x80;
LAB_00165e73:
    pEVar21 = pExpr->pLeft;
    iVar29 = sqlite3ExprIsVector(pEVar21);
    if (iVar29 != 0) {
      pEVar28 = pExpr->pRight;
      iVar12 = sqlite3ExprVectorSize(pEVar21);
      iVar29 = pParse->nLabel + -1;
      pParse->nLabel = iVar29;
      iVar11 = sqlite3ExprVectorSize(pEVar28);
      if (iVar12 != iVar11) goto switchD_00165d2d_caseD_a9;
      uVar13 = uVar13 | 0x20;
      uVar14 = 0x38;
      if (uVar10 != 0x37) {
        uVar14 = uVar10;
      }
      opcode = 0x36;
      if ((char)uVar14 != '9') {
        opcode = uVar14;
      }
      iVar11 = exprCodeSubselect(pParse,pEVar21);
      local_100 = CONCAT44(local_100._4_4_,iVar11);
      local_e8 = pEVar28;
      iVar11 = exprCodeSubselect(pParse,pEVar28);
      pPVar16 = local_108;
      local_e0 = (ExprList *)CONCAT44(local_e0._4_4_,iVar11);
      local_f0 = (sqlite3 *)(ulong)(uint)-iVar12;
      iVar12 = 0;
      while( true ) {
        regFree1_1 = 0;
        regFree2_1 = 0;
        iVar11 = exprVectorRegister(pPVar16,pEVar21,iVar12,(int)local_100,(Expr **)&tempX,
                                    &regFree1_1);
        iVar35 = exprVectorRegister(pPVar16,local_e8,iVar12,(int)local_e0,(Expr **)&opCompare,
                                    &regFree2_1);
        codeCompare(pPVar16,(Expr *)CONCAT26(tempX.flags._2_2_,
                                             CONCAT15(tempX.flags._1_1_,
                                                      CONCAT14((undefined1)tempX.flags,tempX._0_4_))
                                            ),(Expr *)opCompare._0_8_,opcode,iVar11,iVar35,target,
                    uVar13);
        if (regFree1_1 != 0) {
          bVar34 = pPVar16->nTempReg;
          if ((ulong)bVar34 < 8) {
            pPVar16->nTempReg = bVar34 + 1;
            pPVar16->aTempReg[bVar34] = regFree1_1;
          }
        }
        if (regFree2_1 != 0) {
          bVar34 = local_108->nTempReg;
          if ((ulong)bVar34 < 8) {
            local_108->nTempReg = bVar34 + 1;
            local_108->aTempReg[bVar34] = regFree2_1;
          }
        }
        iVar11 = (int)local_f0 + iVar12;
        if (iVar11 == -1) break;
        if ((char)opcode == '4') {
          sqlite3VdbeAddOp2(p,0x12,target,iVar29);
          uVar13 = uVar13 | 8;
          opcode = 0x34;
        }
        else if (opcode == 0x35) {
          sqlite3VdbeAddOp2(p,0x14,target,iVar29);
          uVar13 = uVar13 | 8;
          opcode = 0x35;
        }
        else {
          sqlite3VdbeAddOp2(p,0x3a,0,iVar29);
          if (iVar11 == -2) {
            opcode = uVar10;
          }
        }
        iVar12 = iVar12 + 1;
      }
      goto LAB_001660e4;
    }
    iVar29 = sqlite3ExprCodeTemp(pParse,pEVar21,&regFree1);
    iVar12 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    codeCompare(pParse,pEVar21,pExpr->pRight,uVar10,iVar29,iVar12,target,uVar13 | 0x20);
    goto LAB_0016692c;
  case 0xa1:
    goto switchD_00165d2d_caseD_a1;
  case 0xa2:
    goto switchD_00165d2d_caseD_a2;
  case 0xa3:
    if (pExpr->pAggInfo != (AggInfo *)0x0) {
      return pExpr->pAggInfo->aFunc[pExpr->iAgg].iMem;
    }
    sqlite3ErrorMsg(pParse,"misuse of aggregate: %s()",(pExpr->u).zToken);
    goto LAB_0016692c;
  case 0xa4:
    pAVar4 = pExpr->pAggInfo;
    if (pAVar4->directMode == '\0') {
      return pAVar4->aCol[pExpr->iAgg].iMem;
    }
    if (pAVar4->useSortingIdx != '\0') {
      sqlite3VdbeAddOp3(p,0x5a,pAVar4->sortingIdxPTab,pAVar4->aCol[pExpr->iAgg].iSorterColumn,target
                       );
      return target;
    }
switchD_00165d2d_caseD_a2:
    if ((pExpr->flags & 8) == 0) {
      iVar29 = pExpr->iTable;
      if (iVar29 < 0) {
        iVar29 = pParse->iSelfTab;
        if (iVar29 < 0) {
          return pExpr->iColumn - iVar29;
        }
        iVar29 = iVar29 + -1;
      }
      bVar34 = pExpr->op2;
      sqlite3ExprCodeGetColumnOfTable(p,(pExpr->y).pTab,iVar29,(int)pExpr->iColumn,target);
      if (bVar34 == 0) {
        return target;
      }
      if ((long)p->nOp < 1) {
        return target;
      }
      p->aOp[(long)p->nOp + -1].p5 = (ushort)bVar34;
      return target;
    }
    iVar29 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    if ((long)pExpr->iColumn < 0) {
      iVar12 = 0x44;
    }
    else {
      iVar12 = (int)((pExpr->y).pTab)->aCol[pExpr->iColumn].affinity;
      if (iVar12 == 0x41) {
        return iVar29;
      }
    }
    if (iVar29 != target) {
      sqlite3VdbeAddOp2(p,0x4f,iVar29,target);
    }
    pcVar27 = (char *)((long)yyRuleInfoLhs + (long)(iVar12 * 2) + 0x29c);
    iVar35 = -1;
    iVar29 = 0x5b;
    iVar12 = 1;
    iVar11 = target;
LAB_00166886:
    sqlite3VdbeAddOp4(p,iVar29,iVar11,iVar12,0,pcVar27,iVar35);
    return target;
  case 0xa5:
    pEVar21 = pExpr->pLeft;
    if (pEVar21->op == 0x91) {
      pcVar27 = (pEVar21->u).zToken;
      iVar29 = 1;
      goto LAB_001667e2;
    }
    if (pEVar21->op == 0x93) {
      iVar29 = 1;
      pExpr = pEVar21;
      goto LAB_00166455;
    }
    tempX.op = 0x93;
    tempX.flags._0_1_ = 0;
    tempX.flags._1_1_ = 0x44;
    tempX.flags._2_2_ = 0;
    tempX.u.iValue = 0;
    iVar12 = sqlite3ExprCodeTemp(pParse,&tempX,&regFree1);
    iVar29 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree2);
    uVar10 = 0x65;
    break;
  case 0xa7:
    iVar29 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    bVar33 = (pExpr->pRight->u).zToken[4] == '\0';
    sqlite3VdbeAddOp4Int(p,0x58,iVar29,target,(uint)!bVar33,(uint)((pExpr->op2 == '-') != bVar33));
    goto LAB_0016692c;
  case 0xa8:
    return pExpr->iTable;
  case 0xa9:
switchD_00165d2d_caseD_a9:
    sqlite3ErrorMsg(pParse,"row value misused");
    goto LAB_0016692c;
  case 0xaa:
    pEVar21 = pExpr->pLeft;
    if (pEVar21->iTable == 0) {
      iVar29 = sqlite3CodeSubselect(pParse,pEVar21);
      pEVar21 = pExpr->pLeft;
      pEVar21->iTable = iVar29;
    }
    uVar10 = pExpr->iTable;
    if ((uVar10 != 0) && (uVar13 = sqlite3ExprVectorSize(pEVar21), uVar10 != uVar13)) {
      sqlite3ErrorMsg(pParse,"%d columns assigned %d values",(ulong)uVar10,(ulong)uVar13);
      pEVar21 = pExpr->pLeft;
    }
    return (int)pExpr->iColumn + pEVar21->iTable;
  case 0xab:
    iVar29 = sqlite3VdbeAddOp1(p,0x15,pExpr->iTable);
    target = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    sqlite3VdbeJumpHere(p,iVar29);
    pVVar15 = sqlite3VdbeGetOp(p,iVar29);
    pVVar15->p3 = target;
    goto LAB_0016692c;
  default:
    switch(bVar1) {
    case 0x13:
      goto switchD_00165d2d_caseD_6b;
    case 0x14:
      goto switchD_00165d55_caseD_14;
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2e:
    case 0x2f:
      goto switchD_00165d2d_caseD_6c;
    case 0x24:
      iVar29 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
      if (iVar29 != target) {
        sqlite3VdbeAddOp2(p,0x4f,iVar29,target);
      }
      cVar9 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
      iVar12 = 0x55;
      iVar29 = (int)cVar9;
      uVar10 = target;
      goto LAB_00165db1;
    case 0x2b:
    case 0x2c:
      goto switchD_00165d2d_caseD_60;
    case 0x2d:
      goto switchD_00165d2d_caseD_a0;
    case 0x30:
      exprCodeBetween(pParse,pExpr,target,(_func_void_Parse_ptr_Expr_ptr_int_int *)0x0,0);
      return target;
    case 0x31:
      iVar29 = pParse->nLabel + -1;
      iVar12 = pParse->nLabel + -2;
      pParse->nLabel = iVar12;
      sqlite3VdbeAddOp2(p,0x49,0,target);
      sqlite3ExprCodeIN(pParse,pExpr,iVar29,iVar12);
      sqlite3VdbeAddOp2(p,0x46,1,target);
      sqlite3VdbeResolveLabel(p,iVar29);
      sqlite3VdbeAddOp2(p,0x53,target,0);
      sqlite3VdbeResolveLabel(p,iVar12);
      return target;
    case 0x32:
    case 0x33:
      sqlite3VdbeAddOp2(p,0x46,1,target);
      iVar29 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
      iVar29 = sqlite3VdbeAddOp1(p,(uint)bVar1,iVar29);
      sqlite3VdbeAddOp2(p,0x46,0,target);
      sqlite3VdbeJumpHere(p,iVar29);
      goto LAB_0016692c;
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      uVar13 = 0;
      goto LAB_00165e73;
    default:
      if (bVar1 == 0x47) {
        if (pParse->pTriggerTab == (Table *)0x0) {
          sqlite3ErrorMsg(pParse,"RAISE() may only be used within a trigger-program");
          return 0;
        }
        cVar9 = pExpr->affinity;
        if (cVar9 == '\x04') {
          sqlite3VdbeAddOp4(p,0x45,0,4,0,(pExpr->u).zToken,0);
        }
        else {
          if (cVar9 == '\x02') {
            pPVar16 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar16 = pParse;
            }
            pPVar16->mayAbort = '\x01';
          }
          sqlite3HaltConstraint(pParse,0x713,(int)cVar9,(pExpr->u).zToken,'\0','\0');
        }
        goto LAB_0016692c;
      }
      if (bVar1 == 0x4d) {
        pTVar2 = (pExpr->y).pTab;
        sqlite3VdbeAddOp2(p,0x95,(int)pExpr->iColumn + (pTVar2->nCol + 1) * pExpr->iTable + 1,target
                         );
        if ((-1 < (long)pExpr->iColumn) && (pTVar2->aCol[pExpr->iColumn].affinity == 'E')) {
          sqlite3VdbeAddOp1(p,0x54,target);
        }
        goto LAB_0016692c;
      }
switchD_00165d2d_caseD_6c:
      pSVar3 = (pExpr->x).pSelect;
      iVar29 = *(int *)&pSVar3->pEList;
      iVar12 = pParse->nLabel + -1;
      pParse->nLabel = iVar12;
      pEVar21 = pExpr->pLeft;
      if (pEVar21 == (Expr *)0x0) {
        pEVar28 = (Expr *)0x0;
      }
      else {
        exprNodeCopy(&tempX,pEVar21);
        tempX.iTable = exprCodeVector(pParse,&tempX,&regFree1);
        tempX.op2 = tempX.op;
        tempX.op = 0xa8;
        tempX.flags._1_1_ = tempX.flags._1_1_ & 0xef;
        pEVar28 = &opCompare;
        opCompare.u.zToken = (char *)0x0;
        opCompare.pRight = (Expr *)0x0;
        opCompare.x.pList = (ExprList *)0x0;
        opCompare.nHeight = 0;
        opCompare.iTable = 0;
        opCompare.iColumn = 0;
        opCompare.iAgg = 0;
        opCompare.iRightJoinTable = 0;
        opCompare.op2 = '\0';
        opCompare._55_1_ = 0;
        opCompare.pAggInfo = (AggInfo *)0x0;
        opCompare.y.pTab = (Table *)0x0;
        opCompare.op = '5';
        opCompare.affinity = '\0';
        opCompare._2_2_ = 0;
        opCompare.flags = 0;
        opCompare.pLeft = &tempX;
      }
      regFree1 = 0;
      local_f0 = (sqlite3 *)&pSVar3->op;
      lVar20 = (long)iVar29 - 1;
      ppSVar23 = &pSVar3->pSrc;
      local_e8 = (Expr *)(long)iVar29;
      for (lVar31 = 0; pParse = local_108, lVar31 < lVar20; lVar31 = lVar31 + 2) {
        pExpr_00 = (Expr *)ppSVar23[-4];
        if (pEVar21 != (Expr *)0x0) {
          pExpr_00 = pEVar28;
          opCompare.pRight = (Expr *)ppSVar23[-4];
        }
        iVar29 = local_108->nLabel + -1;
        local_108->nLabel = iVar29;
        sqlite3ExprIfFalse(local_108,pExpr_00,iVar29,0x10);
        sqlite3ExprCode(pParse,(Expr *)*ppSVar23,target);
        sqlite3VdbeGoto(p,iVar12);
        sqlite3VdbeResolveLabel(p,iVar29);
        ppSVar23 = ppSVar23 + 8;
        pEVar28 = pExpr_00;
      }
      if (((ulong)local_e8 & 1) == 0) {
        sqlite3VdbeAddOp2(p,0x49,0,target);
        pParse = local_108;
      }
      else {
        sqlite3ExprCode(local_108,*(Expr **)((long)local_f0 + lVar20 * 0x20),target);
      }
      sqlite3VdbeResolveLabel(p,iVar12);
      goto LAB_0016692c;
    }
  }
  sqlite3VdbeAddOp3(p,uVar10,iVar29,iVar12,target);
  goto LAB_0016692c;
switchD_00165d2d_caseD_6a:
  pExpr = pExpr->pLeft;
  goto LAB_00165d0f;
switchD_00165d2d_caseD_a1:
  uVar10 = pExpr->flags;
  if ((uVar10 >> 0x18 & 1) != 0) {
    return ((pExpr->y).pWin)->regResult;
  }
  db = pParse->db;
  enc = db->enc;
  if (pParse->okConstFactor != '\0') {
    iVar29 = sqlite3ExprIsConstantNotJoin(pExpr);
    if (iVar29 != 0) {
      iVar29 = sqlite3ExprCodeAtInit(pParse,pExpr,-1);
      return iVar29;
    }
    uVar10 = pExpr->flags;
  }
  if (((uVar10 >> 0xe & 1) == 0) && (pEVar30 = (pExpr->x).pList, pEVar30 != (ExprList *)0x0)) {
    uVar10 = pEVar30->nExpr;
    local_e8 = (Expr *)((ulong)local_e8._4_4_ << 0x20);
  }
  else {
    local_e8 = (Expr *)CONCAT44(local_e8._4_4_,(int)CONCAT71((uint7)(uint3)(uVar10 >> 8),1));
    pEVar30 = (ExprList *)0x0;
    uVar10 = 0;
  }
  pcVar27 = (pExpr->u).zToken;
  local_f0 = db;
  zP4 = sqlite3FindFunction(db,pcVar27,uVar10,enc,'\0');
  if ((zP4 == (FuncDef *)0x0) || (zP4->xFinalize != (_func_void_sqlite3_context_ptr *)0x0)) {
    sqlite3ErrorMsg(pParse,"unknown function: %s()",pcVar27);
    goto LAB_0016692c;
  }
  if ((zP4->funcFlags >> 9 & 1) != 0) {
    iVar29 = pParse->nLabel + -1;
    pParse->nLabel = iVar29;
    sqlite3ExprCode(pParse,pEVar30->a[0].pExpr,target);
    pEVar30 = pEVar30 + 1;
    for (lVar20 = 1; lVar20 < (int)uVar10; lVar20 = lVar20 + 1) {
      sqlite3VdbeAddOp2(p,0x33,target,iVar29);
      sqlite3ExprCode(local_108,*(Expr **)pEVar30,target);
      pEVar30 = (ExprList *)&pEVar30->a[0].sortOrder;
    }
LAB_001660e4:
    sqlite3VdbeResolveLabel(p,iVar29);
    pParse = local_108;
LAB_0016692c:
    if (regFree1 != 0) {
      bVar34 = pParse->nTempReg;
      if ((ulong)bVar34 < 8) {
        pParse->nTempReg = bVar34 + 1;
        pParse->aTempReg[bVar34] = regFree1;
      }
    }
    if (regFree2 == 0) {
      return target;
    }
    bVar34 = pParse->nTempReg;
    if (7 < (ulong)bVar34) {
      return target;
    }
    pParse->nTempReg = bVar34 + 1;
    pParse->aTempReg[bVar34] = regFree2;
    return target;
  }
  pEVar24 = pEVar30->a;
  if ((zP4->funcFlags >> 10 & 1) != 0) {
    pExpr = pEVar24->pExpr;
    goto code_r0x00165cd6;
  }
  uVar22 = 0;
  uVar32 = 0;
  if (0 < (int)uVar10) {
    uVar32 = (ulong)uVar10;
  }
  pCVar17 = (CollSeq *)0x0;
  uVar13 = 0;
  local_100 = uVar32;
  local_e0 = (ExprList *)pEVar24;
  for (; uVar8 = local_100, uVar32 != uVar22; uVar22 = uVar22 + 1) {
    if ((uVar22 < 0x20) &&
       (iVar29 = sqlite3ExprIsConstant(pEVar24->pExpr), uVar32 = local_100, iVar29 != 0)) {
      uVar13 = uVar13 | 1 << ((uint)uVar22 & 0x1f);
    }
    if (((zP4->funcFlags & 0x20) != 0) && (pCVar17 == (CollSeq *)0x0)) {
      pCVar17 = sqlite3ExprCollSeq(pParse,pEVar24->pExpr);
    }
    pEVar24 = pEVar24 + 1;
  }
  local_100 = local_100 & 0xffffffff00000000;
  if ((char)local_e8 == '\0') {
    if (uVar13 == 0) {
      iVar29 = sqlite3GetTempRange(pParse,uVar10);
      local_100 = CONCAT44(local_100._4_4_,iVar29);
    }
    else {
      local_100._4_4_ = SUB84(uVar8,4);
      local_100 = CONCAT44(local_100._4_4_,pParse->nMem + 1);
      pParse->nMem = pParse->nMem + uVar10;
    }
    pParse = local_108;
    uVar14 = zP4->funcFlags & 0xc0;
    if (uVar14 != 0) {
      cVar9 = **(char **)local_e0;
      if ((cVar9 == -0x5c) || (cVar9 == -0x5e)) {
        (*(char **)local_e0)[0x36] = (char)uVar14;
      }
    }
    sqlite3ExprCodeExprList(local_108,pEVar30,(int)local_100,0,'\x03');
  }
  local_d0 = pCVar17;
  if ((int)uVar10 < 2) {
    if (uVar10 != 1) goto LAB_00166cc6;
  }
  else if ((pExpr->flags & 0x80) != 0) {
    local_e0 = pEVar30 + 1;
  }
  pcVar27 = *(char **)local_e0;
  tempX.op = '\0';
  tempX.affinity = '\0';
  tempX._2_2_ = 0;
  tempX.flags._0_1_ = 0;
  tempX.flags._1_1_ = 0;
  tempX.flags._2_2_ = 0;
  opCompare.op = '\0';
  opCompare.affinity = '\0';
  opCompare._2_2_ = 0;
  opCompare.flags = 0;
  if ((((pcVar27 != (char *)0x0) && (*pcVar27 == -0x5e)) &&
      (pTVar2 = *(Table **)(pcVar27 + 0x40), pParse = local_108, pTVar2 != (Table *)0x0)) &&
     (pTVar2->nModuleArg != 0)) {
    pVVar18 = sqlite3GetVTable(local_f0,pTVar2);
    p_Var5 = pVVar18->pVtab->pModule->xFindFunction;
    pParse = local_108;
    if ((p_Var5 != (_func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *)0x0) &&
       (iVar29 = (*p_Var5)(pVVar18->pVtab,uVar10,zP4->zName,
                           (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)&tempX,
                           (void **)&opCompare), pParse = local_108, iVar29 != 0)) {
      iVar29 = sqlite3Strlen30(zP4->zName);
      pFVar19 = (FuncDef *)sqlite3DbMallocZero(local_f0,(ulong)(iVar29 + 0x49));
      pParse = local_108;
      if (pFVar19 != (FuncDef *)0x0) {
        pFVar25 = zP4;
        pFVar26 = pFVar19;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          uVar6 = *(undefined3 *)&pFVar25->field_0x1;
          uVar7 = pFVar25->funcFlags;
          pFVar26->nArg = pFVar25->nArg;
          *(undefined3 *)&pFVar26->field_0x1 = uVar6;
          pFVar26->funcFlags = uVar7;
          pFVar25 = (FuncDef *)((long)pFVar25 + (ulong)bVar34 * -0x10 + 8);
          pFVar26 = (FuncDef *)((long)pFVar26 + (ulong)bVar34 * -0x10 + 8);
        }
        pFVar19->zName = &pFVar19[1].nArg;
        pcVar27 = zP4->zName;
        iVar29 = sqlite3Strlen30(pcVar27);
        memcpy(pFVar19 + 1,pcVar27,(ulong)(iVar29 + 1));
        pFVar19->xSFunc =
             (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
             CONCAT26(tempX.flags._2_2_,
                      CONCAT15(tempX.flags._1_1_,CONCAT14((undefined1)tempX.flags,tempX._0_4_)));
        pFVar19->pUserData = (void *)opCompare._0_8_;
        *(byte *)&pFVar19->funcFlags = (byte)pFVar19->funcFlags | 0x10;
        zP4 = pFVar19;
        pParse = local_108;
      }
    }
  }
LAB_00166cc6:
  if ((zP4->funcFlags & 0x20) != 0) {
    pCVar17 = local_d0;
    if (local_d0 == (CollSeq *)0x0) {
      pCVar17 = local_f0->pDfltColl;
    }
    sqlite3VdbeAddOp4(p,0x52,0,0,0,(char *)pCVar17,-2);
  }
  sqlite3VdbeAddOp4(p,(pParse->iSelfTab == 0) + 0x3e,uVar13,(int)local_100,target,&zP4->nArg,-8);
  if (0 < (long)p->nOp) {
    p->aOp[(long)p->nOp + -1].p5 = (ushort)uVar10 & 0xff;
  }
  if ((uVar10 != 0) && (uVar13 == 0)) {
    sqlite3ReleaseTempRange(pParse,(int)local_100,uVar10);
  }
  return target;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTarget(Parse *pParse, Expr *pExpr, int target){
  Vdbe *v = pParse->pVdbe;  /* The VM under construction */
  int op;                   /* The opcode being coded */
  int inReg = target;       /* Results stored in register inReg */
  int regFree1 = 0;         /* If non-zero free this temporary register */
  int regFree2 = 0;         /* If non-zero free this temporary register */
  int r1, r2;               /* Various register numbers */
  Expr tempX;               /* Temporary expression node */
  int p5 = 0;

  assert( target>0 && target<=pParse->nMem );
  if( v==0 ){
    assert( pParse->db->mallocFailed );
    return 0;
  }

expr_code_doover:
  if( pExpr==0 ){
    op = TK_NULL;
  }else{
    op = pExpr->op;
  }
  switch( op ){
    case TK_AGG_COLUMN: {
      AggInfo *pAggInfo = pExpr->pAggInfo;
      struct AggInfo_col *pCol = &pAggInfo->aCol[pExpr->iAgg];
      if( !pAggInfo->directMode ){
        assert( pCol->iMem>0 );
        return pCol->iMem;
      }else if( pAggInfo->useSortingIdx ){
        sqlite3VdbeAddOp3(v, OP_Column, pAggInfo->sortingIdxPTab,
                              pCol->iSorterColumn, target);
        return target;
      }
      /* Otherwise, fall thru into the TK_COLUMN case */
    }
    case TK_COLUMN: {
      int iTab = pExpr->iTable;
      if( ExprHasProperty(pExpr, EP_FixedCol) ){
        /* This COLUMN expression is really a constant due to WHERE clause
        ** constraints, and that constant is coded by the pExpr->pLeft
        ** expresssion.  However, make sure the constant has the correct
        ** datatype by applying the Affinity of the table column to the
        ** constant.
        */
        int iReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft,target);
        int aff = sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
        if( aff!=SQLITE_AFF_BLOB ){
          static const char zAff[] = "B\000C\000D\000E";
          assert( SQLITE_AFF_BLOB=='A' );
          assert( SQLITE_AFF_TEXT=='B' );
          if( iReg!=target ){
            sqlite3VdbeAddOp2(v, OP_SCopy, iReg, target);
            iReg = target;
          }
          sqlite3VdbeAddOp4(v, OP_Affinity, iReg, 1, 0,
                            &zAff[(aff-'B')*2], P4_STATIC);
        }
        return iReg;
      }
      if( iTab<0 ){
        if( pParse->iSelfTab<0 ){
          /* Generating CHECK constraints or inserting into partial index */
          return pExpr->iColumn - pParse->iSelfTab;
        }else{
          /* Coding an expression that is part of an index where column names
          ** in the index refer to the table to which the index belongs */
          iTab = pParse->iSelfTab - 1;
        }
      }
      return sqlite3ExprCodeGetColumn(pParse, pExpr->y.pTab,
                               pExpr->iColumn, iTab, target,
                               pExpr->op2);
    }
    case TK_INTEGER: {
      codeInteger(pParse, pExpr, 0, target);
      return target;
    }
    case TK_TRUEFALSE: {
      sqlite3VdbeAddOp2(v, OP_Integer, sqlite3ExprTruthValue(pExpr), target);
      return target;
    }
#ifndef SQLITE_OMIT_FLOATING_POINT
    case TK_FLOAT: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      codeReal(v, pExpr->u.zToken, 0, target);
      return target;
    }
#endif
    case TK_STRING: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      sqlite3VdbeLoadString(v, target, pExpr->u.zToken);
      return target;
    }
    case TK_NULL: {
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      return target;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case TK_BLOB: {
      int n;
      const char *z;
      char *zBlob;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
      assert( pExpr->u.zToken[1]=='\'' );
      z = &pExpr->u.zToken[2];
      n = sqlite3Strlen30(z) - 1;
      assert( z[n]=='\'' );
      zBlob = sqlite3HexToBlob(sqlite3VdbeDb(v), z, n);
      sqlite3VdbeAddOp4(v, OP_Blob, n/2, target, 0, zBlob, P4_DYNAMIC);
      return target;
    }
#endif
    case TK_VARIABLE: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken!=0 );
      assert( pExpr->u.zToken[0]!=0 );
      sqlite3VdbeAddOp2(v, OP_Variable, pExpr->iColumn, target);
      if( pExpr->u.zToken[1]!=0 ){
        const char *z = sqlite3VListNumToName(pParse->pVList, pExpr->iColumn);
        assert( pExpr->u.zToken[0]=='?' || strcmp(pExpr->u.zToken, z)==0 );
        pParse->pVList[0] = 0; /* Indicate VList may no longer be enlarged */
        sqlite3VdbeAppendP4(v, (char*)z, P4_STATIC);
      }
      return target;
    }
    case TK_REGISTER: {
      return pExpr->iTable;
    }
#ifndef SQLITE_OMIT_CAST
    case TK_CAST: {
      /* Expressions of the form:   CAST(pLeft AS token) */
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      if( inReg!=target ){
        sqlite3VdbeAddOp2(v, OP_SCopy, inReg, target);
        inReg = target;
      }
      sqlite3VdbeAddOp2(v, OP_Cast, target,
                        sqlite3AffinityType(pExpr->u.zToken, 0));
      return inReg;
    }
#endif /* SQLITE_OMIT_CAST */
    case TK_IS:
    case TK_ISNOT:
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      p5 = SQLITE_NULLEQ;
      /* fall-through */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      Expr *pLeft = pExpr->pLeft;
      if( sqlite3ExprIsVector(pLeft) ){
        codeVectorCompare(pParse, pExpr, target, op, p5);
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pLeft, &regFree1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
        codeCompare(pParse, pLeft, pExpr->pRight, op,
            r1, r2, inReg, SQLITE_STOREP2 | p5);
        assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
        assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
        assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
        assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
        assert(TK_EQ==OP_Eq); testcase(op==OP_Eq); VdbeCoverageIf(v,op==OP_Eq);
        assert(TK_NE==OP_Ne); testcase(op==OP_Ne); VdbeCoverageIf(v,op==OP_Ne);
        testcase( regFree1==0 );
        testcase( regFree2==0 );
      }
      break;
    }
    case TK_AND:
    case TK_OR:
    case TK_PLUS:
    case TK_STAR:
    case TK_MINUS:
    case TK_REM:
    case TK_BITAND:
    case TK_BITOR:
    case TK_SLASH:
    case TK_LSHIFT:
    case TK_RSHIFT: 
    case TK_CONCAT: {
      assert( TK_AND==OP_And );            testcase( op==TK_AND );
      assert( TK_OR==OP_Or );              testcase( op==TK_OR );
      assert( TK_PLUS==OP_Add );           testcase( op==TK_PLUS );
      assert( TK_MINUS==OP_Subtract );     testcase( op==TK_MINUS );
      assert( TK_REM==OP_Remainder );      testcase( op==TK_REM );
      assert( TK_BITAND==OP_BitAnd );      testcase( op==TK_BITAND );
      assert( TK_BITOR==OP_BitOr );        testcase( op==TK_BITOR );
      assert( TK_SLASH==OP_Divide );       testcase( op==TK_SLASH );
      assert( TK_LSHIFT==OP_ShiftLeft );   testcase( op==TK_LSHIFT );
      assert( TK_RSHIFT==OP_ShiftRight );  testcase( op==TK_RSHIFT );
      assert( TK_CONCAT==OP_Concat );      testcase( op==TK_CONCAT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      sqlite3VdbeAddOp3(v, op, r2, r1, target);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_UMINUS: {
      Expr *pLeft = pExpr->pLeft;
      assert( pLeft );
      if( pLeft->op==TK_INTEGER ){
        codeInteger(pParse, pLeft, 1, target);
        return target;
#ifndef SQLITE_OMIT_FLOATING_POINT
      }else if( pLeft->op==TK_FLOAT ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        codeReal(v, pLeft->u.zToken, 1, target);
        return target;
#endif
      }else{
        tempX.op = TK_INTEGER;
        tempX.flags = EP_IntValue|EP_TokenOnly;
        tempX.u.iValue = 0;
        r1 = sqlite3ExprCodeTemp(pParse, &tempX, &regFree1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree2);
        sqlite3VdbeAddOp3(v, OP_Subtract, r2, r1, target);
        testcase( regFree2==0 );
      }
      break;
    }
    case TK_BITNOT:
    case TK_NOT: {
      assert( TK_BITNOT==OP_BitNot );   testcase( op==TK_BITNOT );
      assert( TK_NOT==OP_Not );         testcase( op==TK_NOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      sqlite3VdbeAddOp2(v, op, r1, inReg);
      break;
    }
    case TK_TRUTH: {
      int isTrue;    /* IS TRUE or IS NOT TRUE */
      int bNormal;   /* IS TRUE or IS FALSE */
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      bNormal = pExpr->op2==TK_IS;
      testcase( isTrue && bNormal);
      testcase( !isTrue && bNormal);
      sqlite3VdbeAddOp4Int(v, OP_IsTrue, r1, inReg, !isTrue, isTrue ^ bNormal);
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      int addr;
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      addr = sqlite3VdbeAddOp1(v, op, r1);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, target);
      sqlite3VdbeJumpHere(v, addr);
      break;
    }
    case TK_AGG_FUNCTION: {
      AggInfo *pInfo = pExpr->pAggInfo;
      if( pInfo==0 ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        sqlite3ErrorMsg(pParse, "misuse of aggregate: %s()", pExpr->u.zToken);
      }else{
        return pInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    }
    case TK_FUNCTION: {
      ExprList *pFarg;       /* List of function arguments */
      int nFarg;             /* Number of function arguments */
      FuncDef *pDef;         /* The function definition object */
      const char *zId;       /* The function name */
      u32 constMask = 0;     /* Mask of function arguments that are constant */
      int i;                 /* Loop counter */
      sqlite3 *db = pParse->db;  /* The database connection */
      u8 enc = ENC(db);      /* The text encoding used by this database */
      CollSeq *pColl = 0;    /* A collating sequence */

#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(pExpr, EP_WinFunc) ){
        return pExpr->y.pWin->regResult;
      }
#endif

      if( ConstFactorOk(pParse) && sqlite3ExprIsConstantNotJoin(pExpr) ){
        /* SQL functions can be expensive. So try to move constant functions
        ** out of the inner loop, even if that means an extra OP_Copy. */
        return sqlite3ExprCodeAtInit(pParse, pExpr, -1);
      }
      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      if( ExprHasProperty(pExpr, EP_TokenOnly) ){
        pFarg = 0;
      }else{
        pFarg = pExpr->x.pList;
      }
      nFarg = pFarg ? pFarg->nExpr : 0;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      zId = pExpr->u.zToken;
      pDef = sqlite3FindFunction(db, zId, nFarg, enc, 0);
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
      if( pDef==0 && pParse->explain ){
        pDef = sqlite3FindFunction(db, "unknown", nFarg, enc, 0);
      }
#endif
      if( pDef==0 || pDef->xFinalize!=0 ){
        sqlite3ErrorMsg(pParse, "unknown function: %s()", zId);
        break;
      }

      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evaluation of
      ** arguments past the first non-NULL argument.
      */
      if( pDef->funcFlags & SQLITE_FUNC_COALESCE ){
        int endCoalesce = sqlite3VdbeMakeLabel(pParse);
        assert( nFarg>=2 );
        sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
        for(i=1; i<nFarg; i++){
          sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
          VdbeCoverage(v);
          sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
        }
        sqlite3VdbeResolveLabel(v, endCoalesce);
        break;
      }

      /* The UNLIKELY() function is a no-op.  The result is the value
      ** of the first argument.
      */
      if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
        assert( nFarg>=1 );
        return sqlite3ExprCodeTarget(pParse, pFarg->a[0].pExpr, target);
      }

#ifdef SQLITE_DEBUG
      /* The AFFINITY() function evaluates to a string that describes
      ** the type affinity of the argument.  This is used for testing of
      ** the SQLite type logic.
      */
      if( pDef->funcFlags & SQLITE_FUNC_AFFINITY ){
        const char *azAff[] = { "blob", "text", "numeric", "integer", "real" };
        char aff;
        assert( nFarg==1 );
        aff = sqlite3ExprAffinity(pFarg->a[0].pExpr);
        sqlite3VdbeLoadString(v, target, 
                              aff ? azAff[aff-SQLITE_AFF_BLOB] : "none");
        return target;
      }
#endif

      for(i=0; i<nFarg; i++){
        if( i<32 && sqlite3ExprIsConstant(pFarg->a[i].pExpr) ){
          testcase( i==31 );
          constMask |= MASKBIT32(i);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_NEEDCOLL)!=0 && !pColl ){
          pColl = sqlite3ExprCollSeq(pParse, pFarg->a[i].pExpr);
        }
      }
      if( pFarg ){
        if( constMask ){
          r1 = pParse->nMem+1;
          pParse->nMem += nFarg;
        }else{
          r1 = sqlite3GetTempRange(pParse, nFarg);
        }

        /* For length() and typeof() functions with a column argument,
        ** set the P5 parameter to the OP_Column opcode to OPFLAG_LENGTHARG
        ** or OPFLAG_TYPEOFARG respectively, to avoid unnecessary data
        ** loading.
        */
        if( (pDef->funcFlags & (SQLITE_FUNC_LENGTH|SQLITE_FUNC_TYPEOF))!=0 ){
          u8 exprOp;
          assert( nFarg==1 );
          assert( pFarg->a[0].pExpr!=0 );
          exprOp = pFarg->a[0].pExpr->op;
          if( exprOp==TK_COLUMN || exprOp==TK_AGG_COLUMN ){
            assert( SQLITE_FUNC_LENGTH==OPFLAG_LENGTHARG );
            assert( SQLITE_FUNC_TYPEOF==OPFLAG_TYPEOFARG );
            testcase( pDef->funcFlags & OPFLAG_LENGTHARG );
            pFarg->a[0].pExpr->op2 = 
                  pDef->funcFlags & (OPFLAG_LENGTHARG|OPFLAG_TYPEOFARG);
          }
        }

        sqlite3ExprCodeExprList(pParse, pFarg, r1, 0,
                                SQLITE_ECEL_DUP|SQLITE_ECEL_FACTOR);
      }else{
        r1 = 0;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      /* Possibly overload the function if the first argument is
      ** a virtual table column.
      **
      ** For infix functions (LIKE, GLOB, REGEXP, and MATCH) use the
      ** second argument, not the first, as the argument to test to
      ** see if it is a column in a virtual table.  This is done because
      ** the left operand of infix functions (the operand we want to
      ** control overloading) ends up as the second argument to the
      ** function.  The expression "A glob B" is equivalent to 
      ** "glob(B,A).  We want to use the A in "A glob B" to test
      ** for function overloading.  But we use the B term in "glob(B,A)".
      */
      if( nFarg>=2 && ExprHasProperty(pExpr, EP_InfixFunc) ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[1].pExpr);
      }else if( nFarg>0 ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[0].pExpr);
      }
#endif
      if( pDef->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        if( !pColl ) pColl = db->pDfltColl; 
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0, 0, 0, (char *)pColl, P4_COLLSEQ);
      }
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
      if( pDef->funcFlags & SQLITE_FUNC_OFFSET ){
        Expr *pArg = pFarg->a[0].pExpr;
        if( pArg->op==TK_COLUMN ){
          sqlite3VdbeAddOp3(v, OP_Offset, pArg->iTable, pArg->iColumn, target);
        }else{
          sqlite3VdbeAddOp2(v, OP_Null, 0, target);
        }
      }else
#endif
      {
        sqlite3VdbeAddOp4(v, pParse->iSelfTab ? OP_PureFunc0 : OP_Function0,
                          constMask, r1, target, (char*)pDef, P4_FUNCDEF);
        sqlite3VdbeChangeP5(v, (u8)nFarg);
      }
      if( nFarg && constMask==0 ){
        sqlite3ReleaseTempRange(pParse, r1, nFarg);
      }
      return target;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_EXISTS:
    case TK_SELECT: {
      int nCol;
      testcase( op==TK_EXISTS );
      testcase( op==TK_SELECT );
      if( op==TK_SELECT && (nCol = pExpr->x.pSelect->pEList->nExpr)!=1 ){
        sqlite3SubselectError(pParse, nCol, 1);
      }else{
        return sqlite3CodeSubselect(pParse, pExpr);
      }
      break;
    }
    case TK_SELECT_COLUMN: {
      int n;
      if( pExpr->pLeft->iTable==0 ){
        pExpr->pLeft->iTable = sqlite3CodeSubselect(pParse, pExpr->pLeft);
      }
      assert( pExpr->iTable==0 || pExpr->pLeft->op==TK_SELECT );
      if( pExpr->iTable
       && pExpr->iTable!=(n = sqlite3ExprVectorSize(pExpr->pLeft)) 
      ){
        sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                                pExpr->iTable, n);
      }
      return pExpr->pLeft->iTable + pExpr->iColumn;
    }
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(pParse);
      int destIfNull = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, 0);
      sqlite3VdbeResolveLabel(v, destIfNull);
      return target;
    }
#endif /* SQLITE_OMIT_SUBQUERY */


    /*
    **    x BETWEEN y AND z
    **
    ** This is equivalent to
    **
    **    x>=y AND x<=z
    **
    ** X is stored in pExpr->pLeft.
    ** Y is stored in pExpr->pList->a[0].pExpr.
    ** Z is stored in pExpr->pList->a[1].pExpr.
    */
    case TK_BETWEEN: {
      exprCodeBetween(pParse, pExpr, target, 0, 0);
      return target;
    }
    case TK_SPAN:
    case TK_COLLATE: 
    case TK_UPLUS: {
      pExpr = pExpr->pLeft;
      goto expr_code_doover; /* 2018-04-28: Prevent deep recursion. OSSFuzz. */
    }

    case TK_TRIGGER: {
      /* If the opcode is TK_TRIGGER, then the expression is a reference
      ** to a column in the new.* or old.* pseudo-tables available to
      ** trigger programs. In this case Expr.iTable is set to 1 for the
      ** new.* pseudo-table, or 0 for the old.* pseudo-table. Expr.iColumn
      ** is set to the column of the pseudo-table to read, or to -1 to
      ** read the rowid field.
      **
      ** The expression is implemented using an OP_Param opcode. The p1
      ** parameter is set to 0 for an old.rowid reference, or to (i+1)
      ** to reference another column of the old.* pseudo-table, where 
      ** i is the index of the column. For a new.rowid reference, p1 is
      ** set to (n+1), where n is the number of columns in each pseudo-table.
      ** For a reference to any other column in the new.* pseudo-table, p1
      ** is set to (n+2+i), where n and i are as defined previously. For
      ** example, if the table on which triggers are being fired is
      ** declared as:
      **
      **   CREATE TABLE t1(a, b);
      **
      ** Then p1 is interpreted as follows:
      **
      **   p1==0   ->    old.rowid     p1==3   ->    new.rowid
      **   p1==1   ->    old.a         p1==4   ->    new.a
      **   p1==2   ->    old.b         p1==5   ->    new.b       
      */
      Table *pTab = pExpr->y.pTab;
      int p1 = pExpr->iTable * (pTab->nCol+1) + 1 + pExpr->iColumn;

      assert( pExpr->iTable==0 || pExpr->iTable==1 );
      assert( pExpr->iColumn>=-1 && pExpr->iColumn<pTab->nCol );
      assert( pTab->iPKey<0 || pExpr->iColumn!=pTab->iPKey );
      assert( p1>=0 && p1<(pTab->nCol*2+2) );

      sqlite3VdbeAddOp2(v, OP_Param, p1, target);
      VdbeComment((v, "r[%d]=%s.%s", target,
        (pExpr->iTable ? "new" : "old"),
        (pExpr->iColumn<0 ? "rowid" : pExpr->y.pTab->aCol[pExpr->iColumn].zName)
      ));

#ifndef SQLITE_OMIT_FLOATING_POINT
      /* If the column has REAL affinity, it may currently be stored as an
      ** integer. Use OP_RealAffinity to make sure it is really real.
      **
      ** EVIDENCE-OF: R-60985-57662 SQLite will convert the value back to
      ** floating point when extracting it from the record.  */
      if( pExpr->iColumn>=0 
       && pTab->aCol[pExpr->iColumn].affinity==SQLITE_AFF_REAL
      ){
        sqlite3VdbeAddOp1(v, OP_RealAffinity, target);
      }
#endif
      break;
    }

    case TK_VECTOR: {
      sqlite3ErrorMsg(pParse, "row value misused");
      break;
    }

    case TK_IF_NULL_ROW: {
      int addrINR;
      addrINR = sqlite3VdbeAddOp1(v, OP_IfNullRow, pExpr->iTable);
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      sqlite3VdbeJumpHere(v, addrINR);
      sqlite3VdbeChangeP3(v, addrINR, inReg);
      break;
    }

    /*
    ** Form A:
    **   CASE x WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form B:
    **   CASE WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form A is can be transformed into the equivalent form B as follows:
    **   CASE WHEN x=e1 THEN r1 WHEN x=e2 THEN r2 ...
    **        WHEN x=eN THEN rN ELSE y END
    **
    ** X (if it exists) is in pExpr->pLeft.
    ** Y is in the last element of pExpr->x.pList if pExpr->x.pList->nExpr is
    ** odd.  The Y is also optional.  If the number of elements in x.pList
    ** is even, then Y is omitted and the "otherwise" result is NULL.
    ** Ei is in pExpr->pList->a[i*2] and Ri is pExpr->pList->a[i*2+1].
    **
    ** The result of the expression is the Ri for the first matching Ei,
    ** or if there is no matching Ei, the ELSE term Y, or if there is
    ** no ELSE term, NULL.
    */
    default: assert( op==TK_CASE ); {
      int endLabel;                     /* GOTO label for end of CASE stmt */
      int nextCase;                     /* GOTO label for next WHEN clause */
      int nExpr;                        /* 2x number of WHEN terms */
      int i;                            /* Loop counter */
      ExprList *pEList;                 /* List of WHEN terms */
      struct ExprList_item *aListelem;  /* Array of WHEN terms */
      Expr opCompare;                   /* The X==Ei expression */
      Expr *pX;                         /* The X expression */
      Expr *pTest = 0;                  /* X==Ei (form A) or just Ei (form B) */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) && pExpr->x.pList );
      assert(pExpr->x.pList->nExpr > 0);
      pEList = pExpr->x.pList;
      aListelem = pEList->a;
      nExpr = pEList->nExpr;
      endLabel = sqlite3VdbeMakeLabel(pParse);
      if( (pX = pExpr->pLeft)!=0 ){
        exprNodeCopy(&tempX, pX);
        testcase( pX->op==TK_COLUMN );
        exprToRegister(&tempX, exprCodeVector(pParse, &tempX, &regFree1));
        testcase( regFree1==0 );
        memset(&opCompare, 0, sizeof(opCompare));
        opCompare.op = TK_EQ;
        opCompare.pLeft = &tempX;
        pTest = &opCompare;
        /* Ticket b351d95f9cd5ef17e9d9dbae18f5ca8611190001:
        ** The value in regFree1 might get SCopy-ed into the file result.
        ** So make sure that the regFree1 register is not reused for other
        ** purposes and possibly overwritten.  */
        regFree1 = 0;
      }
      for(i=0; i<nExpr-1; i=i+2){
        if( pX ){
          assert( pTest!=0 );
          opCompare.pRight = aListelem[i].pExpr;
        }else{
          pTest = aListelem[i].pExpr;
        }
        nextCase = sqlite3VdbeMakeLabel(pParse);
        testcase( pTest->op==TK_COLUMN );
        sqlite3ExprIfFalse(pParse, pTest, nextCase, SQLITE_JUMPIFNULL);
        testcase( aListelem[i+1].pExpr->op==TK_COLUMN );
        sqlite3ExprCode(pParse, aListelem[i+1].pExpr, target);
        sqlite3VdbeGoto(v, endLabel);
        sqlite3VdbeResolveLabel(v, nextCase);
      }
      if( (nExpr&1)!=0 ){
        sqlite3ExprCode(pParse, pEList->a[nExpr-1].pExpr, target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      sqlite3VdbeResolveLabel(v, endLabel);
      break;
    }
#ifndef SQLITE_OMIT_TRIGGER
    case TK_RAISE: {
      assert( pExpr->affinity==OE_Rollback 
           || pExpr->affinity==OE_Abort
           || pExpr->affinity==OE_Fail
           || pExpr->affinity==OE_Ignore
      );
      if( !pParse->pTriggerTab ){
        sqlite3ErrorMsg(pParse,
                       "RAISE() may only be used within a trigger-program");
        return 0;
      }
      if( pExpr->affinity==OE_Abort ){
        sqlite3MayAbort(pParse);
      }
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      if( pExpr->affinity==OE_Ignore ){
        sqlite3VdbeAddOp4(
            v, OP_Halt, SQLITE_OK, OE_Ignore, 0, pExpr->u.zToken,0);
        VdbeCoverage(v);
      }else{
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_TRIGGER,
                              pExpr->affinity, pExpr->u.zToken, 0, 0);
      }

      break;
    }
#endif
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
  return inReg;
}